

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rawbin.c
# Opt level: O3

void rawbin_writeexec(GlobalVars *gv,FILE *f,bool singlefile,char header)

{
  bool bVar1;
  LinkedSection *pLVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  FILE *__stream;
  long bytes;
  ulong bytes_00;
  ulong unaff_R13;
  ulong uVar5;
  LinkedSection *unaff_R15;
  LinkedSection *ls;
  
  pLVar2 = get_next_section((GlobalVars *)(gv->lnksec).first);
  if (pLVar2 != (LinkedSection *)0x0) {
    bVar1 = true;
    __stream = (FILE *)f;
    do {
      while (((ls = pLVar2, ls->size != 0 && ((ls->flags & 1) != 0)) && ((ls->ld_flags & 1) == 0)))
      {
        calc_relocs(gv,ls);
        if (gv->output_sections == 0) {
          if (bVar1) {
            if ((FILE *)gv->trace_file != (FILE *)0x0) {
              fprintf((FILE *)gv->trace_file,"Base address = 0x%08lx.\n",ls->copybase);
            }
LAB_001269ba:
            rawbin_writeheader(gv,(FILE *)__stream,ls,header);
          }
          else {
            uVar5 = ls->copybase;
            bytes_00 = uVar5 - unaff_R13;
            if (uVar5 < unaff_R13 || bytes_00 == 0) {
              if (uVar5 < unaff_R13) {
                bVar1 = false;
                error(0x62,fff[gv->dest_format]->tname,ls->name,unaff_R15->name);
                goto LAB_00126a16;
              }
            }
            else {
              if ((singlefile == 0) && (0xf < bytes_00)) {
                if (__stream != (FILE *)f) {
                  fclose(__stream);
                }
                sVar3 = strlen(gv->dest_name);
                sVar4 = strlen(ls->name);
                __s = (char *)alloc(sVar3 + sVar4 + 2);
                sprintf(__s,"%s.%s",gv->dest_name,ls->name);
                __stream = fopen(__s,"wb");
                if (__stream == (FILE *)0x0) goto LAB_00126b77;
                free(__s);
                goto LAB_001269ba;
              }
              fwritegap((FILE *)__stream,bytes_00);
            }
          }
          bVar1 = false;
        }
        else {
          if ((FILE *)gv->trace_file != (FILE *)0x0) {
            fprintf((FILE *)gv->trace_file,"Base address section %s = 0x%08lx.\n",ls->name,
                    ls->copybase);
          }
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          if (gv->osec_base_name == (char *)0x0) {
            __s = ls->name;
          }
          else {
            sVar3 = strlen(gv->osec_base_name);
            sVar4 = strlen(ls->name);
            __s = (char *)alloc(sVar3 + sVar4 + 2);
            sprintf(__s,"%s.%s",gv->osec_base_name,ls->name);
          }
          __stream = fopen(__s,"wb");
          if (__stream == (FILE *)0x0) {
LAB_00126b77:
            error(0x1d,__s);
            return;
          }
          if (gv->osec_base_name != (char *)0x0) {
            free(__s);
          }
          rawbin_writeheader(gv,(FILE *)__stream,ls,header);
        }
LAB_00126a16:
        fwritex((FILE *)__stream,ls->data,ls->filesize);
        uVar5 = ls->size;
        bytes = uVar5 - ls->filesize;
        if (ls->filesize <= uVar5 && bytes != 0) {
          fwritegap((FILE *)__stream,bytes);
          uVar5 = ls->size;
        }
        unaff_R13 = uVar5 + ls->copybase;
        pLVar2 = get_next_section((GlobalVars *)(gv->lnksec).first);
        unaff_R15 = ls;
        if (pLVar2 == (LinkedSection *)0x0) goto LAB_00126b42;
      }
      pLVar2 = get_next_section((GlobalVars *)(gv->lnksec).first);
    } while (pLVar2 != (LinkedSection *)0x0);
LAB_00126b42:
    if (__stream != (FILE *)f && __stream != (FILE *)0x0) {
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

static void rawbin_writeexec(struct GlobalVars *gv,FILE *f,bool singlefile,
                             char header)
/* creates executable raw-binary files (with absolute addresses) */
{
  FILE *firstfile = f;
  bool firstsec = TRUE;
  unsigned long addr;
  struct LinkedSection *ls,*prevls;
  char *name;

  while (ls = get_next_section(gv)) {
    if (ls->size==0 || !(ls->flags & SF_ALLOC) || (ls->ld_flags & LSF_NOLOAD))
      continue;  /* ignore empty sections */

    /* resolve all relocations */
    calc_relocs(gv,ls);

    if (gv->output_sections) {
      /* make a new file for each output section */
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address section %s = 0x%08lx.\n",
                ls->name,ls->copybase);
      if (f != NULL)
        fclose(f);
      if (gv->osec_base_name != NULL) {
        /* use a common base name before the section name */
        name = alloc(strlen(gv->osec_base_name)+strlen(ls->name)+2);
        sprintf(name,"%s.%s",gv->osec_base_name,ls->name);
      }
      else
        name = (char *)ls->name;
      if (!(f = fopen(name,"wb"))) {
        error(29,name);
        break;
      }
      if (gv->osec_base_name != NULL)
        free(name);
      rawbin_writeheader(gv,f,ls,header);
    }
    else if (firstsec) {
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address = 0x%08lx.\n",ls->copybase);
      firstsec = FALSE;
      rawbin_writeheader(gv,f,ls,header);
    }
    else {
      /* handle gaps between this and the previous section */
      if (ls->copybase > addr) {
        if (ls->copybase-addr < MAXGAP || singlefile) {
          fwritegap(f,ls->copybase-addr);
        }
        else {  /* open a new file for this section */
          if (f != firstfile)
            fclose(f);
          name = alloc(strlen(gv->dest_name)+strlen(ls->name)+2);
          sprintf(name,"%s.%s",gv->dest_name,ls->name);
          if (!(f = fopen(name,"wb"))) {
            error(29,name);
            break;
          }
          free(name);
          rawbin_writeheader(gv,f,ls,header);
        }
      }
      else if (ls->copybase < addr)
        error(98,fff[gv->dest_format]->tname,ls->name,prevls->name);
    }

    /* write section contents */
    fwritex(f,ls->data,ls->filesize);
    if (ls->filesize < ls->size)
      fwritegap(f,ls->size - ls->filesize);

    addr = ls->copybase + ls->size;
    prevls = ls;
  }

  if (f!=NULL && f!=firstfile)
    fclose(f);
}